

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::CombinationalLoopVisitor::has_var(Var *var,Var *target)

{
  bool bVar1;
  VarType VVar2;
  bool local_29;
  Expr *expr;
  Var *target_local;
  Var *var_local;
  
  if (var == (Var *)0x0) {
    var_local._7_1_ = false;
  }
  else if (var == target) {
    var_local._7_1_ = true;
  }
  else {
    VVar2 = Var::type(var);
    if (VVar2 == Expression) {
      bVar1 = has_var((Var *)var[1].super_IRNode.fn_name_ln.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,target);
      local_29 = true;
      if (!bVar1) {
        local_29 = has_var((Var *)var[1].super_IRNode.fn_name_ln.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,target);
      }
      var_local._7_1_ = local_29;
    }
    else {
      var_local._7_1_ = false;
    }
  }
  return var_local._7_1_;
}

Assistant:

static bool has_var(Var* var, Var* target) {
        if (!var) return false;
        if (var == target) return true;
        if (var->type() == VarType::Expression) {
            auto* expr = reinterpret_cast<Expr*>(var);
            return has_var(expr->left, target) || has_var(expr->right, target);
        }
        return false;
    }